

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

void defilter_sub3(size_t rowbytes,uchar *row)

{
  undefined4 uVar1;
  undefined3 uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  
  uVar3 = '\0';
  uVar5 = '\0';
  uVar7 = '\0';
  uVar4 = '\0';
  uVar6 = '\0';
  uVar8 = '\0';
  if (3 < rowbytes) {
    do {
      uVar1 = *(undefined4 *)row;
      uVar3 = uVar3 + (char)uVar1;
      uVar5 = uVar5 + (char)((uint)uVar1 >> 8);
      uVar7 = uVar7 + (char)((uint)uVar1 >> 0x10);
      *row = uVar3;
      row[1] = uVar5;
      row[2] = uVar7;
      row = row + 3;
      rowbytes = rowbytes - 3;
      uVar4 = uVar3;
      uVar6 = uVar5;
      uVar8 = uVar7;
    } while (3 < rowbytes);
  }
  if (rowbytes != 0) {
    uVar2 = *(undefined3 *)row;
    *(ushort *)row = CONCAT11(uVar6 + (char)((uint3)uVar2 >> 8),uVar4 + (char)uVar2);
    row[2] = uVar8 + (char)((uint3)uVar2 >> 0x10);
  }
  return;
}

Assistant:

static void defilter_sub3(size_t rowbytes, unsigned char *row)
{
    /* The Sub filter predicts each pixel as the previous pixel, a.
     * There is no pixel to the left of the first pixel.  It's encoded directly.
     * That works with our main loop if we just say that left pixel was zero.
     */
    size_t rb = rowbytes;

    __m128i a, d = _mm_setzero_si128();

    while(rb >= 4)
    {
        a = d; d = load4(row);
        d = _mm_add_epi8(d, a);
        store3(row, d);

        row += 3;
        rb  -= 3;
    }

    if(rb > 0)
    {
        a = d; d = load3(row);
        d = _mm_add_epi8(d, a);
        store3(row, d);
    }
}